

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_input.hpp
# Opt level: O1

void __thiscall
tao::pegtl::
string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
string_input<std::__cxx11::string_const&,char_const(&)[6]>
          (string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_data,
          char (*in_source) [6])

{
  pointer pcVar1;
  long lVar2;
  size_t sVar3;
  
  *(string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
    **)this = this + 0x10;
  pcVar1 = (in_data->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + in_data->_M_string_length);
  lVar2 = *(long *)this;
  *(long *)(this + 0x20) = lVar2;
  *(long *)(this + 0x28) = lVar2;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 1;
  *(undefined8 *)(this + 0x40) = 0;
  *(long *)(this + 0x48) = *(long *)(this + 8) + lVar2;
  *(string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
    **)(this + 0x50) = this + 0x60;
  sVar3 = strlen(*in_source);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this + 0x50),in_source,*in_source + sVar3);
  return;
}

Assistant:

explicit string_input( V&& in_data, T&& in_source, Ts&&... ts )
            : internal::string_holder( std::forward< V >( in_data ) ),
              memory_input< P, Eol, Source >( data.data(), data.size(), std::forward< T >( in_source ), std::forward< Ts >( ts )... )
         {
         }